

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_banded.c
# Opt level: O3

parasail_result_t *
parasail_nw_banded(char *_s1,int s1Len,char *_s2,int s2Len,int open,int gap,int k,
                  parasail_matrix_t *matrix)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  parasail_result_t *ppVar5;
  int *ptr;
  int *ptr_00;
  int *b;
  int *b_00;
  ulong uVar6;
  uint uVar7;
  size_t size;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  
  if (_s1 == (char *)0x0) {
    parasail_nw_banded_cold_8();
  }
  else if (s1Len < 1) {
    parasail_nw_banded_cold_7();
  }
  else if (_s2 == (char *)0x0) {
    parasail_nw_banded_cold_6();
  }
  else {
    uVar6 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_nw_banded_cold_5();
    }
    else if (open < 0) {
      parasail_nw_banded_cold_4();
    }
    else if (gap < 0) {
      parasail_nw_banded_cold_3();
    }
    else if (k < 1) {
      parasail_nw_banded_cold_2();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_nw_banded_cold_1();
    }
    else {
      ppVar5 = parasail_result_new();
      if (ppVar5 != (parasail_result_t *)0x0) {
        ppVar5->flag = ppVar5->flag | 0x1400181;
        ptr = parasail_memalign_int(0x10,(ulong)(uint)s1Len);
        ptr_00 = parasail_memalign_int(0x10,uVar6);
        if (ptr_00 != (int *)0x0 && ptr != (int *)0x0) {
          uVar7 = (s1Len - s2Len) - k;
          uVar2 = uVar7;
          if ((uint)s2Len < (uint)s1Len) {
            uVar7 = -k;
            uVar2 = (s2Len - s1Len) - k;
          }
          iVar3 = k - uVar2;
          size = (size_t)(iVar3 + 3);
          b = parasail_memalign_int(0x10,size);
          if ((b != (int *)0x0) && (b_00 = parasail_memalign_int(0x10,size), b_00 != (int *)0x0)) {
            uVar12 = iVar3 + 1;
            uVar13 = 0;
            parasail_memset_int(b,0,size);
            parasail_memset_int(b_00,0,size);
            piVar1 = matrix->mapper;
            do {
              ptr[uVar13] = piVar1[(byte)_s1[uVar13]];
              uVar13 = uVar13 + 1;
            } while ((uint)s1Len != uVar13);
            piVar1 = matrix->mapper;
            uVar13 = 0;
            do {
              ptr_00[uVar13] = piVar1[(byte)_s2[uVar13]];
              uVar13 = uVar13 + 1;
            } while (uVar6 != uVar13);
            iVar4 = 1 - uVar7;
            if (iVar4 <= iVar3) {
              iVar8 = -open;
              lVar10 = 0;
              do {
                b[(long)iVar4 + lVar10 + 1] = iVar8;
                b_00[(long)iVar4 + lVar10 + 1] = -0x40000000;
                lVar10 = lVar10 + 1;
                iVar8 = iVar8 - gap;
              } while ((k + uVar7) - uVar2 != (int)lVar10);
            }
            b[(long)(int)~uVar7 + 1] = -open;
            b_00[(long)(int)~uVar7 + 1] = -0x40000000;
            b[(long)(int)-uVar7 + 1] = 0;
            b_00[(long)(int)-uVar7 + 1] = -0x40000000;
            *b = -0x40000000;
            *b_00 = -0x40000000;
            b[(long)(int)uVar12 + 1] = -0x40000000;
            b_00[(long)(int)uVar12 + 1] = -0x40000000;
            lVar10 = (long)(int)uVar7;
            uVar13 = 0;
            do {
              if (lVar10 < 0) {
                b[(ulong)~(uint)lVar10 + 1] = -open - (int)uVar13 * gap;
              }
              if (-1 < iVar3) {
                iVar4 = -0x40000000;
                uVar9 = 0;
                do {
                  uVar7 = (uint)(uVar9 + lVar10);
                  if (uVar7 < (uint)s1Len) {
                    if (matrix->type == 0) {
                      uVar7 = ptr[uVar9 + lVar10];
                    }
                    iVar11 = b[uVar9 + 1] +
                             matrix->matrix
                             [(long)(int)(matrix->size * uVar7) + (long)ptr_00[uVar13]];
                    iVar4 = iVar4 - gap;
                    iVar8 = b_00[uVar9 + 2] - gap;
                    if (b_00[uVar9 + 2] - gap < b[uVar9 + 2] - open) {
                      iVar8 = b[uVar9 + 2] - open;
                    }
                    if (iVar4 < b[uVar9] - open) {
                      iVar4 = b[uVar9] - open;
                    }
                    b_00[uVar9 + 1] = iVar8;
                    if (iVar8 <= iVar4) {
                      iVar8 = iVar4;
                    }
                    if (iVar8 <= iVar11) {
                      iVar8 = iVar11;
                    }
                    b[uVar9 + 1] = iVar8;
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar9 != uVar12);
              }
              lVar10 = lVar10 + 1;
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar6);
            uVar6 = (ulong)(uint)k;
            if ((uint)s2Len < (uint)s1Len) {
              uVar6 = (long)(int)-uVar2;
            }
            ppVar5->score = b[uVar6 + 1];
            ppVar5->end_query = s1Len + -1;
            ppVar5->end_ref = s2Len + -1;
            parasail_free(b_00);
            parasail_free(b);
            parasail_free(ptr_00);
            parasail_free(ptr);
            return ppVar5;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const int k,
        const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * HB = NULL;
    int * H = NULL;
    int * EB = NULL;
    int * E = NULL;
    int i = 0;
    int j = 0;
    int low = 0;
    int colLen = 0;
    int colOff = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s1);
    PARASAIL_CHECK_GT0(s1Len);
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_GT0(k);
    PARASAIL_CHECK_NULL(matrix);

    /* initialize stack variables */

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_BANDED
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initalize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;

    low = s1Len - s2Len - k;
    if (s1Len > s2Len) {
        low = s2Len - s1Len - k;
    }
    colLen = k-low+1;
    colOff = s1Len > s2Len ? -k : low;

    HB = parasail_memalign_int(16, colLen+2);
    if (!HB) return NULL;
    H = HB+1;
    EB = parasail_memalign_int(16, colLen+2);
    if (!EB) return NULL;
    E = EB+1;
    parasail_memset_int(HB, 0, colLen+2);
    parasail_memset_int(EB, 0, colLen+2);

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

#ifdef PARASAIL_TABLE
    /* fill the table with zeros */
    {
        int limit = s1Len*s2Len;
        for (i=0; i<limit; ++i) {
            result->tables->score_table[i] = 0;
        }
    }
#endif

    /* initialize H */
    /* initialize E */
    for (i=-colOff+1,j=0; i<colLen; ++i, ++j) {
        H[i] = -open - j*gap;
        E[i] = NEG_INF_32;
    }
    H[-colOff-1] = -open;
    E[-colOff-1] = NEG_INF_32;
    H[-colOff] = 0;
    E[-colOff] = NEG_INF_32;
    H[-1] = NEG_INF_32;
    E[-1] = NEG_INF_32;
    H[colLen] = NEG_INF_32;
    E[colLen] = NEG_INF_32;

    /* iter over db */
    for (j=0; j<s2Len; ++j) {
        /* substitution matrix row (really we wanted a column) */
        int F = NEG_INF_32;
        if (colOff < 0) {
            H[-colOff-1] = -open - j*gap;
        }
        /* iter over query */
        for (i=0; i<colLen; ++i) {
            int pos = 0;
            int H_dag = 0;
            int E_opn = 0;
            int E_ext = 0;
            int F_opn = 0;
            int F_ext = 0;
            int matval = 0;
            pos = colOff+i;
            if (pos < 0 || pos >= s1Len) {
                continue;
            }
            matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                     matrix->matrix[matrix->size*s1[pos]+s2[j]] :
                     matrix->matrix[matrix->size*pos+s2[j]];
            H_dag = H[i] + matval;
            E_opn = H[i+1] - open;
            E_ext = E[i+1] - gap;
            F_opn = H[i-1] - open;
            F_ext = F - gap;
            E[i] = MAX(E_opn, E_ext);
            F = MAX(F_opn, F_ext);
            H[i] = MAX(E[i], F);
            H[i] = MAX(H[i], H_dag);
#ifdef PARASAIL_TABLE
            result->tables->score_table[pos*s2Len + j] = H[i];
#endif
        }
        colOff += 1;
    }

    result->score = s1Len > s2Len ? H[-low] : H[k];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;

    parasail_free(EB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}